

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
::clear(raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
        *this)

{
  size_t sVar1;
  
  if (this->size_ == 0) {
    return;
  }
  sVar1 = this->capacity_;
  if (sVar1 != 0) {
    this->size_ = 0;
    memset(this->ctrl_,0x80,sVar1 + 0x10);
    this->ctrl_[sVar1] = -1;
    reset_growth_left(this,this->capacity_);
    if (this->size_ == 0) {
      return;
    }
  }
  __assert_fail("empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x50a,
                "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::IntPolicy, phmap::Hash<int64_t>, std::equal_to<long>, std::allocator<long>>::clear() [Policy = phmap::priv::(anonymous namespace)::IntPolicy, Hash = phmap::Hash<int64_t>, Eq = std::equal_to<long>, Alloc = std::allocator<long>]"
               );
}

Assistant:

bool empty() const { return !size(); }